

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable_locks.c
# Opt level: O3

void lock_test1(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  tr_socket *__ptr;
  int iVar3;
  spki_record *ski;
  rtr_socket *socket;
  long lVar4;
  uint i;
  rtr_socket *__arg;
  undefined8 *__arg_00;
  int ASN;
  spki_record **ppsVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 local_4e8;
  undefined4 local_4e0 [76];
  undefined8 uStack_3b0;
  undefined1 auStack_3a8 [8];
  undefined1 *local_3a0;
  uint local_394;
  undefined1 auStack_390 [4];
  uint result_size;
  spki_record *result;
  rtr_socket local_2e8 [2];
  undefined1 local_1a8 [8];
  spki_table spkit;
  
  local_3a0 = auStack_3a8;
  spkit.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  uStack_3b0 = 0x1022a3;
  spki_table_init((spki_table *)local_1a8,(spki_update_fp)0x0);
  __arg = local_2e8;
  ppsVar5 = &result;
  do {
    __arg->tr_socket = (tr_socket *)local_1a8;
    __arg->refresh_interval = (uint)lVar4;
    *(undefined4 *)&__arg->field_0xc = 10000;
    uStack_3b0 = 0x1022d7;
    socket = __arg;
    pthread_create((pthread_t *)ppsVar5,(pthread_attr_t *)0x0,add_records,__arg);
    lVar4 = lVar4 + 10000;
    __arg = (rtr_socket *)&__arg->last_update;
    ppsVar5 = ppsVar5 + 1;
  } while (lVar4 != 200000);
  lVar4 = 0;
  do {
    uStack_3b0 = 0x102308;
    pthread_join((pthread_t)(&result)[lVar4],(void **)0x0);
    uStack_3b0 = 0x102315;
    printf("Thread %i returned\n");
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x14);
  local_394 = 0;
  ASN = 0;
  while( true ) {
    uStack_3b0 = 0x10234a;
    ski = create_record(ASN,ASN,ASN,socket);
    uStack_3b0 = 0x102365;
    socket = (rtr_socket *)auStack_390;
    spki_table_get_all((spki_table *)local_1a8,ski->asn,ski->ski,(spki_record **)auStack_390,
                       &local_394);
    __ptr = _auStack_390;
    if (local_394 != 1) {
      uStack_3b0 = 0x10250c;
      __assert_fail("result_size == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                    ,0x90,"void lock_test1(void)");
    }
    if ((ski->asn != *(uint32_t *)(_auStack_390 + 0x14)) ||
       (ski->socket != *(rtr_socket **)(_auStack_390 + 0x78))) break;
    auVar6[0] = -(*_auStack_390 == (tr_socket)ski->ski[0]);
    auVar6[1] = -(_auStack_390[1] == *(tr_socket *)(ski->ski + 1));
    auVar6[2] = -(_auStack_390[2] == *(tr_socket *)(ski->ski + 2));
    auVar6[3] = -(_auStack_390[3] == *(tr_socket *)(ski->ski + 3));
    auVar6[4] = -(_auStack_390[4] == *(tr_socket *)(ski->ski + 4));
    auVar6[5] = -(_auStack_390[5] == *(tr_socket *)(ski->ski + 5));
    auVar6[6] = -(_auStack_390[6] == *(tr_socket *)(ski->ski + 6));
    auVar6[7] = -(_auStack_390[7] == *(tr_socket *)(ski->ski + 7));
    auVar6[8] = -(_auStack_390[8] == *(tr_socket *)(ski->ski + 8));
    auVar6[9] = -(_auStack_390[9] == *(tr_socket *)(ski->ski + 9));
    auVar6[10] = -(_auStack_390[10] == *(tr_socket *)(ski->ski + 10));
    auVar6[0xb] = -(_auStack_390[0xb] == *(tr_socket *)(ski->ski + 0xb));
    auVar6[0xc] = -(_auStack_390[0xc] == *(tr_socket *)(ski->ski + 0xc));
    auVar6[0xd] = -(_auStack_390[0xd] == *(tr_socket *)(ski->ski + 0xd));
    auVar6[0xe] = -(_auStack_390[0xe] == *(tr_socket *)(ski->ski + 0xe));
    auVar6[0xf] = -(_auStack_390[0xf] == *(tr_socket *)(ski->ski + 0xf));
    uVar1 = *(undefined4 *)(ski->ski + 0x10);
    uVar2 = *(undefined4 *)(_auStack_390 + 0x10);
    auVar7[0] = -((char)uVar2 == (char)uVar1);
    auVar7[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
    auVar7[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
    auVar7[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
    auVar7[4] = 0xff;
    auVar7[5] = 0xff;
    auVar7[6] = 0xff;
    auVar7[7] = 0xff;
    auVar7[8] = 0xff;
    auVar7[9] = 0xff;
    auVar7[10] = 0xff;
    auVar7[0xb] = 0xff;
    auVar7[0xc] = 0xff;
    auVar7[0xd] = 0xff;
    auVar7[0xe] = 0xff;
    auVar7[0xf] = 0xff;
    auVar7 = auVar7 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) != 0xffff) break;
    uStack_3b0 = 0x1023dc;
    iVar3 = bcmp(ski->spki,_auStack_390 + 0x18,0x5b);
    if (iVar3 != 0) break;
    uStack_3b0 = 0x1023ec;
    free(__ptr);
    uStack_3b0 = 0x1023f4;
    free(ski);
    ASN = ASN + 1;
    if (ASN == 200000) {
      __arg_00 = &local_4e8;
      ppsVar5 = &result;
      lVar4 = 0;
      do {
        *__arg_00 = (spki_table *)local_1a8;
        *(int *)(__arg_00 + 1) = (int)lVar4;
        *(undefined4 *)((long)__arg_00 + 0xc) = 10000;
        pthread_create((pthread_t *)ppsVar5,(pthread_attr_t *)0x0,remove_records,__arg_00);
        lVar4 = lVar4 + 10000;
        __arg_00 = __arg_00 + 2;
        ppsVar5 = ppsVar5 + 1;
      } while (lVar4 != 200000);
      lVar4 = 0;
      do {
        pthread_join((pthread_t)(&result)[lVar4],(void **)0x0);
        printf("Thread %i returned\n");
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x14);
      spki_table_free((spki_table *)local_1a8);
      printf("%s() complete\n","lock_test1");
      if (*(long *)(in_FS_OFFSET + 0x28) == spkit.lock._48_8_) {
        return;
      }
      *(code **)(local_3a0 + -8) = add_records;
      __stack_chk_fail();
    }
  }
  uStack_3b0 = 0x1024ed;
  __assert_fail("compare_spki_records(record, &result[0])",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                ,0x91,"void lock_test1(void)");
}

Assistant:

static void lock_test1(void)
{
	unsigned int max_threads = 20;
	unsigned int records_per_thread = 10000;
	struct spki_table spkit;
	struct add_records_args args[max_threads];

	spki_table_init(&spkit, NULL);
	pthread_t threads[max_threads];

	/* Concurrently add SPKI records to the table */
	for (unsigned int i = 0; i < max_threads; i++) {
		args[i].table = &spkit;
		args[i].start_asn = i * records_per_thread;
		args[i].count = records_per_thread;
		pthread_create(&threads[i], NULL, (void *(*)(void *))add_records, &args[i]);
	}

	/* Wait for parallel add operations to finish */
	for (unsigned int i = 0; i < max_threads; i++) {
		pthread_join(threads[i], NULL);
		printf("Thread %i returned\n", i);
	}

	/* Check all records for successful add */
	struct spki_record *result;
	unsigned int result_size = 0;

	for (unsigned int i = 0; i < records_per_thread * max_threads; i++) {
		struct spki_record *record = create_record(i, i, i, NULL);

		spki_table_get_all(&spkit, record->asn, record->ski, &result, &result_size);
		assert(result_size == 1);
		assert(compare_spki_records(record, &result[0]));
		free(result);
		free(record);
	}

	struct remove_records_args remove_args[max_threads];
	/* Concurrently delete SPKI records */
	for (unsigned int i = 0; i < max_threads; i++) {
		remove_args[i].table = &spkit;
		remove_args[i].start_asn = i * records_per_thread;
		remove_args[i].count = records_per_thread;
		pthread_create(&threads[i], NULL, (void *(*)(void *))remove_records, &remove_args[i]);
	}

	/* Wait for parallel delete operation to finish */
	for (unsigned int i = 0; i < max_threads; i++) {
		pthread_join(threads[i], NULL);
		printf("Thread %i returned\n", i);
	}

	/* cleanup: free spki_table */
	spki_table_free(&spkit);
	printf("%s() complete\n", __func__);
}